

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::Duration::_InternalParse(Duration *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  ulong uVar4;
  UnknownFieldSet *unknown;
  byte *p;
  uint uVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  byte *local_38;
  char *ptr_local;
  
  local_38 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    do {
      bVar1 = *local_38;
      uVar5 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar6 = internal::ReadTagFallback((char *)local_38,uVar5);
          p = (byte *)pVar6.first;
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          uVar5 = pVar6.second;
        }
        else {
          p = local_38 + 2;
        }
      }
      local_38 = p;
      if (uVar5 >> 3 == 2) {
        if ((char)uVar5 != '\x10') goto LAB_002b31b3;
        bVar1 = *p;
        uVar5 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar5 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar7 = internal::VarintParseSlow64((char *)p,uVar5);
            local_38 = (byte *)pVar7.first;
            this->nanos_ = (int32)pVar7.second;
            goto LAB_002b31ee;
          }
          local_38 = p + 2;
        }
        this->nanos_ = uVar5;
      }
      else if ((uVar5 >> 3 == 1) && ((char)uVar5 == '\b')) {
        uVar4 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar4 < 0) {
          uVar5 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar7 = internal::VarintParseSlow64((char *)p,uVar5);
            local_38 = (byte *)pVar7.first;
            this->seconds_ = pVar7.second;
            goto LAB_002b31ee;
          }
          uVar4 = (ulong)uVar5;
          local_38 = p + 2;
        }
        this->seconds_ = uVar4;
      }
      else {
LAB_002b31b3:
        if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
          return (char *)p;
        }
        pvVar2 = this_00->ptr_;
        if (((ulong)pvVar2 & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar5,unknown,(char *)local_38,ctx);
LAB_002b31ee:
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_38;
}

Assistant:

const char* Duration::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // int64 seconds = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          seconds_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // int32 nanos = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          nanos_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}